

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O2

void __thiscall cppcms::http::context::make_error_message(context *this,exception *e)

{
  response *this_00;
  char cVar1;
  bool bVar2;
  level_type lVar3;
  ostream *poVar4;
  char *pcVar5;
  service *this_01;
  cached_settings *pcVar6;
  char *in_RCX;
  void *__buf;
  void *__buf_00;
  string local_1b0;
  ostringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [22];
  
  lVar3 = booster::log::logger::instance();
  cVar1 = booster::log::logger::should_be_logged(lVar3,(char *)0x1e);
  if (cVar1 != '\0') {
    in_RCX = 
    "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/http_context.cpp";
    booster::log::message::message
              ((message *)&ss,error,"cppcms",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/http_context.cpp"
               ,0x150);
    poVar4 = (ostream *)booster::log::message::out();
    poVar4 = std::operator<<(poVar4,"Caught exception [");
    pcVar5 = (char *)(**(code **)(*(long *)e + 0x10))(e);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"]\n");
    local_1b0._M_dataplus._M_p = (pointer)booster::trace<std::exception>(e);
    booster::details::trace_manip::write((trace_manip *)&local_1b0,(int)poVar4,__buf,(size_t)in_RCX)
    ;
    booster::log::message::~message((message *)&ss);
  }
  bVar2 = http::response::some_output_was_written
                    ((((this->d).ptr_)->response)._M_t.
                     super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                     .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl);
  if (!bVar2) {
    this_01 = service(this);
    pcVar6 = cppcms::service::cached_settings(this_01);
    if ((pcVar6->security).display_error_message == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      pcVar5 = (char *)(**(code **)(*(long *)e + 0x10))(e);
      poVar4 = std::operator<<((ostream *)&ss,pcVar5);
      std::operator<<(poVar4,'\n');
      local_1b0._M_dataplus._M_p = (pointer)booster::trace<std::exception>(e);
      booster::details::trace_manip::write
                ((trace_manip *)&local_1b0,(int)&ss,__buf_00,(size_t)in_RCX);
      this_00 = (((this->d).ptr_)->response)._M_t.
                super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                ._M_t.
                super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl;
      std::__cxx11::stringbuf::str();
      http::response::make_error_response(this_00,500,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
    }
    else {
      _ss = (pointer)local_180;
      local_180[0]._M_local_buf[0] = '\0';
      http::response::make_error_response
                ((((this->d).ptr_)->response)._M_t.
                 super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
                 .super__Head_base<0UL,_cppcms::http::response_*,_false>._M_head_impl,500,
                 (string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
    }
  }
  return;
}

Assistant:

void context::make_error_message(std::exception const &e)
{
	BOOSTER_ERROR("cppcms") << "Caught exception ["<<e.what()<<"]\n" << booster::trace(e)  ;
	if(!response().some_output_was_written()) {
		if(service().cached_settings().security.display_error_message) {
			std::ostringstream ss;
			ss << e.what() << '\n';
			ss << booster::trace(e);
			response().make_error_response(http::response::internal_server_error,ss.str());
		}
		else
			response().make_error_response(http::response::internal_server_error);
	}
}